

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtilities.cpp
# Opt level: O0

String * Rml::StringUtilities::Replace
                   (String *__return_storage_ptr__,String *subject,char search,char replace)

{
  ulong uVar1;
  char *pcVar2;
  undefined8 local_30;
  size_t i;
  size_t size;
  char replace_local;
  char search_local;
  String *subject_local;
  
  uVar1 = ::std::__cxx11::string::size();
  for (local_30 = 0; local_30 < uVar1; local_30 = local_30 + 1) {
    pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)subject);
    if (*pcVar2 == search) {
      pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)subject);
      *pcVar2 = replace;
    }
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)subject);
  return __return_storage_ptr__;
}

Assistant:

String StringUtilities::Replace(String subject, char search, char replace)
{
	const size_t size = subject.size();
	for (size_t i = 0; i < size; i++)
	{
		if (subject[i] == search)
			subject[i] = replace;
	}
	return subject;
}